

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugrid2mesh.c
# Opt level: O0

double swapd(double d)

{
  int iVar1;
  double in_XMM0_Qa;
  uchar *src;
  uchar *dst;
  double a;
  undefined8 local_18;
  undefined1 local_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  undefined8 local_8;
  
  iVar1 = littleEndian();
  local_8 = in_XMM0_Qa;
  if (iVar1 != 0) {
    uStack_9 = (undefined1)((ulong)in_XMM0_Qa >> 0x38);
    local_18._0_1_ = uStack_9;
    uStack_a = (undefined1)((ulong)in_XMM0_Qa >> 0x30);
    local_18._1_1_ = uStack_a;
    uStack_b = (undefined1)((ulong)in_XMM0_Qa >> 0x28);
    local_18._2_1_ = uStack_b;
    uStack_c = (undefined1)((ulong)in_XMM0_Qa >> 0x20);
    local_18._3_1_ = uStack_c;
    uStack_d = (undefined1)((ulong)in_XMM0_Qa >> 0x18);
    local_18._4_1_ = uStack_d;
    uStack_e = (undefined1)((ulong)in_XMM0_Qa >> 0x10);
    local_18._5_1_ = uStack_e;
    uStack_f = (undefined1)((ulong)in_XMM0_Qa >> 8);
    local_18._6_1_ = uStack_f;
    local_10 = SUB81(in_XMM0_Qa,0);
    local_18._7_1_ = local_10;
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

double swapd(double d)
{
   double a;
   unsigned char *dst = (unsigned char *)&a;
   unsigned char *src = (unsigned char *)&d;

   if ( ! littleEndian() ) return d;

   dst[0] = src[7];
   dst[1] = src[6];
   dst[2] = src[5];
   dst[3] = src[4];
   dst[4] = src[3];
   dst[5] = src[2];
   dst[6] = src[1];
   dst[7] = src[0];

   return a;
}